

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::Normalizer2Impl::compose
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool onlyContiguous,UBool doCompose,
          ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  ushort *puVar1;
  UChar UVar2;
  UChar UVar3;
  ushort uVar4;
  UChar UVar5;
  ushort uVar6;
  void *pvVar7;
  UBool UVar8;
  byte bVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  ushort uVar13;
  uint uVar14;
  int32_t iVar15;
  UChar *prevSrc;
  UChar *pUVar16;
  uint c;
  UCPTrie *pUVar17;
  short sVar18;
  long lVar19;
  UChar *pUVar20;
  UChar *pUVar21;
  UChar *pUVar22;
  bool bVar23;
  
  UVar2 = this->minCompNoMaybeCP;
  pUVar16 = src;
  if (limit == (UChar *)0x0) {
    lVar19 = 2;
    pUVar20 = src + -2;
    do {
      pUVar21 = pUVar20;
      pUVar20 = pUVar21 + 1;
      lVar19 = lVar19 + -2;
      if (pUVar21[2] == L'\0') break;
    } while ((ushort)pUVar21[2] < (ushort)UVar2);
    pUVar21 = pUVar21 + 2;
    if (lVar19 != 0 && doCompose != '\0') {
      ReorderingBuffer::appendZeroCC(buffer,src,pUVar21,errorCode);
    }
    if (U_ZERO_ERROR < *errorCode) {
      return '\0';
    }
    limit = u_strchr_63(pUVar21,L'\0');
    if ((lVar19 != 0) &&
       (UVar8 = hasCompBoundaryAfter(this,(uint)(ushort)*pUVar20,onlyContiguous), src = pUVar21,
       pUVar16 = pUVar21, UVar8 == '\0')) {
      ReorderingBuffer::removeSuffix(buffer,1);
      src = pUVar20;
      pUVar16 = pUVar20;
    }
  }
joined_r0x00296ba6:
  pUVar21 = pUVar16;
  pUVar20 = src;
  if (pUVar20 != limit) {
    do {
      UVar3 = *pUVar20;
      c = (uint)(ushort)UVar3;
      if ((ushort)UVar3 < (ushort)UVar2) {
LAB_00296bee:
        src = pUVar20 + 1;
      }
      else {
        pUVar17 = this->normTrie;
        pvVar7 = (pUVar17->data).ptr0;
        uVar4 = *(ushort *)
                 ((long)pvVar7 +
                 (ulong)(((ushort)UVar3 & 0x3f) + (uint)pUVar17->index[(ushort)UVar3 >> 6]) * 2);
        uVar13 = this->minNoNo;
        if (uVar4 < uVar13) goto LAB_00296bee;
        src = pUVar20 + 1;
        if (((ushort)UVar3 & 0xfc00) != 0xd800) goto LAB_00296c82;
        if ((src != limit) && (((ushort)*src & 0xfc00) == 0xdc00)) {
          c = (uint)(ushort)UVar3 * 0x400 + (uint)(ushort)*src + 0xfca02400;
          if ((int)c < pUVar17->highStart) {
            iVar11 = ucptrie_internalSmallIndex_63(pUVar17,c);
            uVar13 = this->minNoNo;
          }
          else {
            iVar11 = pUVar17->dataLength + -2;
          }
          src = pUVar20 + 2;
          uVar4 = *(ushort *)((long)pvVar7 + (long)iVar11 * 2);
          if (uVar13 <= uVar4) goto LAB_00296c82;
        }
      }
      pUVar20 = src;
      if (pUVar20 == limit) break;
    } while( true );
  }
  if (doCompose == '\0') {
    return '\x01';
  }
  if (pUVar21 == limit) {
    return '\x01';
  }
LAB_00297551:
  ReorderingBuffer::appendZeroCC(buffer,pUVar21,limit,errorCode);
  return '\x01';
LAB_00296c82:
  uVar12 = (uint)uVar4;
  if (uVar4 < this->minMaybeYes) {
    if (doCompose == '\0') {
      return '\0';
    }
    if (uVar4 < this->limitNoNo) {
      if (uVar4 < this->minNoNoCompBoundaryBefore) {
        if ((((uVar4 & 1) != 0) &&
            (((onlyContiguous == '\0' || (uVar4 == 1)) ||
             (*(ushort *)((long)this->extraData + (ulong)(uVar12 & 0xfffe)) < 0x200)))) ||
           (UVar8 = hasCompBoundaryBefore(this,src,limit), UVar8 != '\0')) {
          if ((pUVar21 != pUVar20) &&
             (UVar8 = ReorderingBuffer::appendZeroCC(buffer,pUVar21,pUVar20,errorCode),
             UVar8 == '\0')) {
            return '\x01';
          }
          puVar1 = (ushort *)((long)this->extraData + (ulong)(uVar12 & 0xfffe));
          cVar10 = ReorderingBuffer::appendZeroCC
                             (buffer,(UChar *)(puVar1 + 1),
                              (UChar *)((long)this->extraData +
                                       (ulong)(*puVar1 & 0x1f) * 2 + (ulong)(uVar12 & 0xfffe) + 2),
                              errorCode);
          goto LAB_0029704d;
        }
      }
      else if ((this->minNoNoEmpty <= uVar4) &&
              ((UVar8 = hasCompBoundaryBefore(this,src,limit), UVar8 != '\0' ||
               (UVar8 = hasCompBoundaryAfter(this,pUVar21,pUVar20,onlyContiguous), UVar8 != '\0'))))
      {
        pUVar16 = src;
        if (pUVar21 == pUVar20) goto joined_r0x00296ba6;
        UVar8 = ReorderingBuffer::appendZeroCC(buffer,pUVar21,pUVar20,errorCode);
        bVar23 = UVar8 == '\0';
        goto LAB_00297062;
      }
    }
    else if ((((uVar4 & 1) != 0) && ((onlyContiguous == '\0' || ((uVar4 & 6) < 3)))) ||
            (UVar8 = hasCompBoundaryBefore(this,src,limit), UVar8 != '\0')) {
      if ((pUVar21 != pUVar20) &&
         (UVar8 = ReorderingBuffer::appendZeroCC(buffer,pUVar21,pUVar20,errorCode), UVar8 == '\0'))
      {
        return '\x01';
      }
      cVar10 = ReorderingBuffer::append
                         (buffer,(c + (uVar4 >> 3)) - (uint)this->centerNoNoDelta,'\0',errorCode);
LAB_0029704d:
      bVar23 = cVar10 == '\0';
      goto LAB_00297062;
    }
  }
  else if ((uVar12 == 0xfe00) && (pUVar21 != pUVar20)) {
    pUVar16 = pUVar20 + -1;
    UVar3 = pUVar20[-1];
    if (c < 0x11a7) {
      if ((ushort)(UVar3 + L'\xef00') < 0x13) {
        if (doCompose == '\0') {
          return '\0';
        }
        if ((src == limit) || (0x1a < (ushort)(*src + L'\xee58'))) {
          UVar8 = hasCompBoundaryBefore(this,src,limit);
          sVar18 = 0;
          if (UVar8 == '\0') goto LAB_00296f5c;
        }
        else {
          sVar18 = *src + L'\xee59';
          src = src + 1;
        }
        if ((pUVar21 != pUVar16) &&
           (UVar8 = ReorderingBuffer::appendZeroCC(buffer,pUVar21,pUVar16,errorCode), UVar8 == '\0')
           ) {
          return '\x01';
        }
        UVar8 = ReorderingBuffer::appendBMP
                          (buffer,((short)c + (UVar3 + L'\xef00') * 0x15) * 0x1c + sVar18 + L'앤',
                           '\0',errorCode);
        bVar23 = UVar8 == '\0';
LAB_00297062:
        pUVar16 = src;
        if (bVar23) {
          return '\x01';
        }
        goto joined_r0x00296ba6;
      }
    }
    else {
      uVar12 = (ushort)UVar3 - 0xac00;
      if ((uVar12 < 0x2ba4) &&
         (uVar14 = (uVar12 & 0xffff) >> 2,
         (short)uVar12 == (short)((short)(uVar14 / 7) * 0x1b + (short)(uVar14 / 7)))) {
        if (doCompose == '\0') {
          return '\0';
        }
        if ((pUVar21 != pUVar16) &&
           (UVar8 = ReorderingBuffer::appendZeroCC(buffer,pUVar21,pUVar16,errorCode), UVar8 == '\0')
           ) {
          return '\x01';
        }
        UVar8 = ReorderingBuffer::appendBMP(buffer,UVar3 + (short)c + L'\xee59','\0',errorCode);
        bVar23 = UVar8 == '\0';
        goto LAB_00297062;
      }
    }
  }
  else if (0xfe00 < uVar12) {
    uVar13 = uVar4 >> 1;
    pUVar22 = src;
    if ((onlyContiguous == '\0') ||
       (bVar9 = getPreviousTrailCC(this,pUVar21,pUVar20), bVar9 <= (byte)uVar13)) {
      do {
        src = pUVar22;
        if (src == limit) {
          if (doCompose == '\0') {
            return '\x01';
          }
          goto LAB_00297551;
        }
        pUVar22 = src + 1;
        UVar3 = *src;
        if ((UVar3 & 0xf800U) == 0xd800) {
          if ((((ushort)UVar3 >> 10 & 1) == 0) && (pUVar22 != limit)) {
            UVar5 = *pUVar22;
            pUVar17 = this->normTrie;
            if ((UVar5 & 0xfc00U) == 0xdc00) {
              pUVar22 = src + 2;
              iVar11 = (uint)(ushort)UVar3 * 0x400 + (uint)(ushort)UVar5 + -0x35fdc00;
              if (iVar11 < pUVar17->highStart) {
                iVar11 = ucptrie_internalSmallIndex_63(pUVar17,iVar11);
                pUVar17 = this->normTrie;
              }
              else {
                iVar11 = pUVar17->dataLength + -2;
              }
              goto LAB_0029720f;
            }
          }
          else {
            pUVar17 = this->normTrie;
          }
          iVar11 = pUVar17->dataLength + -1;
        }
        else {
          pUVar17 = this->normTrie;
          iVar11 = ((ushort)UVar3 & 0x3f) + (uint)pUVar17->index[(ushort)UVar3 >> 6];
        }
LAB_0029720f:
        uVar6 = *(ushort *)((long)(pUVar17->data).ptr0 + (long)iVar11 * 2);
        if (uVar6 < 0xfe02) goto LAB_0029743f;
        bVar9 = (byte)uVar13;
        uVar13 = uVar6 >> 1;
      } while (bVar9 <= (byte)(uVar6 >> 1));
      if (doCompose == '\0') {
        return '\0';
      }
LAB_0029743f:
      if ((uVar6 < this->minNoNoCompNoMaybeCC) ||
         ((this->limitNoNo <= uVar6 && (uVar6 < this->minMaybeYes)))) {
        pUVar16 = pUVar21;
        if (uVar6 < this->minNoNo) {
          src = pUVar22;
        }
        goto joined_r0x00296ba6;
      }
    }
    else if (doCompose == '\0') {
      return '\0';
    }
  }
LAB_00296f5c:
  if (((pUVar21 == pUVar20) || (uVar4 < this->minNoNoCompNoMaybeCC)) ||
     ((this->limitNoNo <= uVar4 && (uVar4 < this->minMaybeYes)))) goto LAB_002972b0;
  pUVar16 = pUVar20 + -1;
  UVar3 = pUVar20[-1];
  if ((UVar3 & 0xf800U) == 0xd800) {
    if ((pUVar16 != pUVar21 & (byte)((ushort)UVar3 >> 10) & 1) == 0) {
      pUVar17 = this->normTrie;
    }
    else {
      pUVar17 = this->normTrie;
      if ((pUVar20[-2] & 0xfc00U) == 0xd800) {
        pUVar16 = pUVar20 + -2;
        iVar11 = (uint)(ushort)UVar3 + (uint)(ushort)pUVar20[-2] * 0x400 + -0x35fdc00;
        if (iVar11 < pUVar17->highStart) {
          iVar11 = ucptrie_internalSmallIndex_63(pUVar17,iVar11);
          pUVar17 = this->normTrie;
        }
        else {
          iVar11 = pUVar17->dataLength + -2;
        }
        goto LAB_0029729b;
      }
    }
    iVar11 = pUVar17->dataLength + -1;
  }
  else {
    pUVar17 = this->normTrie;
    iVar11 = ((ushort)UVar3 & 0x3f) + (uint)pUVar17->index[(ushort)UVar3 >> 6];
  }
LAB_0029729b:
  uVar13 = *(ushort *)((long)(pUVar17->data).ptr0 + (long)iVar11 * 2);
  if ((uVar13 & 1) != 0) {
    if ((onlyContiguous == '\0') || (uVar13 == 1)) goto LAB_002972b0;
    if (uVar13 < this->limitNoNo) {
      if (*(ushort *)((long)this->extraData + (ulong)(uVar13 & 0xfffe)) < 0x200) goto LAB_002972b0;
    }
    else if ((uVar13 & 6) < 3) goto LAB_002972b0;
  }
  pUVar20 = pUVar16;
LAB_002972b0:
  if (((doCompose != '\0') && (pUVar21 != pUVar20)) &&
     (UVar8 = ReorderingBuffer::appendZeroCC(buffer,pUVar21,pUVar20,errorCode), UVar8 == '\0')) {
    return '\x01';
  }
  pUVar16 = buffer->limit;
  pUVar21 = buffer->start;
  decomposeShort(this,pUVar20,src,'\0',onlyContiguous,buffer,errorCode);
  src = decomposeShort(this,src,limit,'\x01',onlyContiguous,buffer,errorCode);
  if (U_ZERO_ERROR < *errorCode) {
    return '\x01';
  }
  if (0xfffffffe < (long)src - (long)pUVar20) {
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return '\x01';
  }
  recompose(this,buffer,(int32_t)((ulong)((long)pUVar16 - (long)pUVar21) >> 1),onlyContiguous);
  pUVar16 = src;
  if (doCompose == '\0') {
    UVar8 = ReorderingBuffer::equals(buffer,pUVar20,src);
    if (UVar8 == '\0') {
      return '\0';
    }
    buffer->limit = buffer->start;
    buffer->reorderStart = buffer->start;
    iVar15 = 0x1b;
    if (((buffer->str->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      iVar15 = (buffer->str->fUnion).fFields.fCapacity;
    }
    buffer->remainingCapacity = iVar15;
    buffer->lastCC = '\0';
  }
  goto joined_r0x00296ba6;
}

Assistant:

UBool
Normalizer2Impl::compose(const UChar *src, const UChar *limit,
                         UBool onlyContiguous,
                         UBool doCompose,
                         ReorderingBuffer &buffer,
                         UErrorCode &errorCode) const {
    const UChar *prevBoundary=src;
    UChar32 minNoMaybeCP=minCompNoMaybeCP;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minNoMaybeCP,
                                           doCompose ? &buffer : NULL,
                                           errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        limit=u_strchr(src, 0);
        if (prevBoundary != src) {
            if (hasCompBoundaryAfter(*(src-1), onlyContiguous)) {
                prevBoundary = src;
            } else {
                buffer.removeSuffix(1);
                prevBoundary = --src;
            }
        }
    }

    for (;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const UChar *prevSrc;
        UChar32 c = 0;
        uint16_t norm16 = 0;
        for (;;) {
            if (src == limit) {
                if (prevBoundary != limit && doCompose) {
                    buffer.appendZeroCC(prevBoundary, limit, errorCode);
                }
                return TRUE;
            }
            if( (c=*src)<minNoMaybeCP ||
                isCompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else {
                prevSrc = src++;
                if(!U16_IS_LEAD(c)) {
                    break;
                } else {
                    UChar c2;
                    if(src!=limit && U16_IS_TRAIL(c2=*src)) {
                        ++src;
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                        norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                        if(!isCompYesAndZeroCC(norm16)) {
                            break;
                        }
                    }
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        // Medium-fast path: Handle cases that do not require full decomposition and recomposition.
        if (!isMaybeOrNonZeroCC(norm16)) {  // minNoNo <= norm16 < minMaybeYes
            if (!doCompose) {
                return FALSE;
            }
            // Fast path for mapping a character that is immediately surrounded by boundaries.
            // In this case, we need not decompose around the current character.
            if (isDecompNoAlgorithmic(norm16)) {
                // Maps to a single isCompYesAndZeroCC character
                // which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    if(!buffer.append(mapAlgorithmic(c, norm16), 0, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 < minNoNoCompBoundaryBefore) {
                // The mapping is comp-normalized which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    const UChar *mapping = reinterpret_cast<const UChar *>(getMapping(norm16));
                    int32_t length = *mapping++ & MAPPING_LENGTH_MASK;
                    if(!buffer.appendZeroCC(mapping, mapping + length, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 >= minNoNoEmpty) {
                // The current character maps to nothing.
                // Simply omit it from the output if there is a boundary before _or_ after it.
                // The character itself implies no boundaries.
                if (hasCompBoundaryBefore(src, limit) ||
                        hasCompBoundaryAfter(prevBoundary, prevSrc, onlyContiguous)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            }
            // Other "noNo" type, or need to examine more text around this character:
            // Fall through to the slow path.
        } else if (isJamoVT(norm16) && prevBoundary != prevSrc) {
            UChar prev=*(prevSrc-1);
            if(c<Hangul::JAMO_T_BASE) {
                // The current character is a Jamo Vowel,
                // compose with previous Jamo L and following Jamo T.
                UChar l = (UChar)(prev-Hangul::JAMO_L_BASE);
                if(l<Hangul::JAMO_L_COUNT) {
                    if (!doCompose) {
                        return FALSE;
                    }
                    int32_t t;
                    if (src != limit &&
                            0 < (t = ((int32_t)*src - Hangul::JAMO_T_BASE)) &&
                            t < Hangul::JAMO_T_COUNT) {
                        // The next character is a Jamo T.
                        ++src;
                    } else if (hasCompBoundaryBefore(src, limit)) {
                        // No Jamo T follows, not even via decomposition.
                        t = 0;
                    } else {
                        t = -1;
                    }
                    if (t >= 0) {
                        UChar32 syllable = Hangul::HANGUL_BASE +
                            (l*Hangul::JAMO_V_COUNT + (c-Hangul::JAMO_V_BASE)) *
                            Hangul::JAMO_T_COUNT + t;
                        --prevSrc;  // Replace the Jamo L as well.
                        if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                            break;
                        }
                        if(!buffer.appendBMP((UChar)syllable, 0, errorCode)) {
                            break;
                        }
                        prevBoundary = src;
                        continue;
                    }
                    // If we see L+V+x where x!=T then we drop to the slow path,
                    // decompose and recompose.
                    // This is to deal with NFKC finding normal L and V but a
                    // compatibility variant of a T.
                    // We need to either fully compose that combination here
                    // (which would complicate the code and may not work with strange custom data)
                    // or use the slow path.
                }
            } else if (Hangul::isHangulLV(prev)) {
                // The current character is a Jamo Trailing consonant,
                // compose with previous Hangul LV that does not contain a Jamo T.
                if (!doCompose) {
                    return FALSE;
                }
                UChar32 syllable = prev + c - Hangul::JAMO_T_BASE;
                --prevSrc;  // Replace the Hangul LV as well.
                if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                    break;
                }
                if(!buffer.appendBMP((UChar)syllable, 0, errorCode)) {
                    break;
                }
                prevBoundary = src;
                continue;
            }
            // No matching context, or may need to decompose surrounding text first:
            // Fall through to the slow path.
        } else if (norm16 > JAMO_VT) {  // norm16 >= MIN_YES_YES_WITH_CC
            // One or more combining marks that do not combine-back:
            // Check for canonical order, copy unchanged if ok and
            // if followed by a character with a boundary-before.
            uint8_t cc = getCCFromNormalYesOrMaybe(norm16);  // cc!=0
            if (onlyContiguous /* FCC */ && getPreviousTrailCC(prevBoundary, prevSrc) > cc) {
                // Fails FCD test, need to decompose and contiguously recompose.
                if (!doCompose) {
                    return FALSE;
                }
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const UChar *nextSrc;
                uint16_t n16;
                for (;;) {
                    if (src == limit) {
                        if (doCompose) {
                            buffer.appendZeroCC(prevBoundary, limit, errorCode);
                        }
                        return TRUE;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, c, n16);
                    if (n16 >= MIN_YES_YES_WITH_CC) {
                        cc = getCCFromNormalYesOrMaybe(n16);
                        if (prevCC > cc) {
                            if (!doCompose) {
                                return FALSE;
                            }
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                // If there is a boundary here, then we continue with no change.
                if (norm16HasCompBoundaryBefore(n16)) {
                    if (isCompYesAndZeroCC(n16)) {
                        src = nextSrc;
                    }
                    continue;
                }
                // Use the slow path. There is no boundary in [prevSrc, src[.
            }
        }

        // Slow path: Find the nearest boundaries around the current character,
        // decompose and recompose.
        if (prevBoundary != prevSrc && !norm16HasCompBoundaryBefore(norm16)) {
            const UChar *p = prevSrc;
            UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, prevBoundary, p, c, norm16);
            if (!norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
                prevSrc = p;
            }
        }
        if (doCompose && prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
            break;
        }
        int32_t recomposeStartIndex=buffer.length();
        // We know there is not a boundary here.
        decomposeShort(prevSrc, src, FALSE /* !stopAtCompBoundary */, onlyContiguous,
                       buffer, errorCode);
        // Decompose until the next boundary.
        src = decomposeShort(src, limit, TRUE /* stopAtCompBoundary */, onlyContiguous,
                             buffer, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        if ((src - prevSrc) > INT32_MAX) {  // guard before buffer.equals()
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return TRUE;
        }
        recompose(buffer, recomposeStartIndex, onlyContiguous);
        if(!doCompose) {
            if(!buffer.equals(prevSrc, src)) {
                return FALSE;
            }
            buffer.remove();
        }
        prevBoundary=src;
    }
    return TRUE;
}